

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O2

string * __thiscall
cfd::core::BlockHash::GetHex_abi_cxx11_(string *__return_storage_ptr__,BlockHash *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  allocator_type local_51;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&this->data_
                    );
  local_30.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_28._M_impl.super__Vector_impl_data._M_finish;
  local_38.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_28._M_impl.super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,&local_30,&local_38,
             &local_51);
  StringUtil::ByteToString_abi_cxx11_
            ((string *)__return_storage_ptr__,(StringUtil *)&local_50,bytes);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

const std::string BlockHash::GetHex() const {
  const std::vector<uint8_t>& data = data_.GetBytes();
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  return StringUtil::ByteToString(reverse_buffer);
}